

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

void __thiscall
testing::Action<solitaire::interfaces::Solitaire_&()>::Action
          (Action<solitaire::interfaces::Solitaire_&()> *this,
          ActionInterface<solitaire::interfaces::Solitaire_&()> *impl)

{
  ActionAdapter local_28;
  ActionInterface<solitaire::interfaces::Solitaire_&()> *local_18;
  ActionInterface<solitaire::interfaces::Solitaire_&()> *impl_local;
  Action<solitaire::interfaces::Solitaire_&()> *this_local;
  
  local_18 = impl;
  impl_local = (ActionInterface<solitaire::interfaces::Solitaire_&()> *)this;
  std::shared_ptr<testing::ActionInterface<solitaire::interfaces::Solitaire&()>>::
  shared_ptr<testing::ActionInterface<solitaire::interfaces::Solitaire&()>,void>
            ((shared_ptr<testing::ActionInterface<solitaire::interfaces::Solitaire&()>> *)&local_28,
             impl);
  std::function<solitaire::interfaces::Solitaire&()>::
  function<testing::Action<solitaire::interfaces::Solitaire&()>::ActionAdapter,void>
            ((function<solitaire::interfaces::Solitaire&()> *)this,&local_28);
  ActionAdapter::~ActionAdapter(&local_28);
  return;
}

Assistant:

explicit Action(ActionInterface<F>* impl)
      : fun_(ActionAdapter{::std::shared_ptr<ActionInterface<F>>(impl)}) {}